

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O0

void Test35(void)

{
  CMReturn In;
  CMOptions Options;
  undefined1 auVar1 [24];
  CMOptions Options_00;
  CMOptions Options_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_27a0;
  allocator<char> local_2779;
  string local_2778;
  string local_2758;
  allocator<char> local_2731;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2730;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_26f0;
  int local_26d0;
  allocator<char> local_26c9;
  string local_26c8;
  string local_26a8;
  allocator<char> local_2681;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2640;
  int local_2620;
  allocator<char> local_2619;
  string local_2618;
  string local_25f8;
  allocator<char> local_25d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2590;
  _CM_RETURN_STATUS local_256c;
  pointer local_2568;
  undefined8 uStack_2560;
  undefined8 local_2558;
  undefined8 uStack_2550;
  undefined8 local_2548;
  undefined8 uStack_2540;
  allocator<char> local_2531;
  string local_2530;
  allocator<char> local_2509;
  string local_2508;
  CMReturn local_24e8;
  allocator<char> local_24c9;
  string local_24c8;
  string local_24a8;
  allocator<char> local_2481;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2440;
  int local_2420;
  allocator<char> local_2419;
  string local_2418;
  string local_23f8;
  allocator<char> local_23d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_23d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_23b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2390;
  int local_2370;
  allocator<char> local_2369;
  string local_2368;
  string local_2348;
  allocator<char> local_2321;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_22e0;
  _CM_RETURN_STATUS local_22bc;
  pointer local_22b8;
  undefined8 uStack_22b0;
  undefined8 local_22a8;
  undefined8 uStack_22a0;
  undefined8 local_2298;
  undefined8 uStack_2290;
  allocator<char> local_2279;
  string local_2278;
  allocator<char> local_2251;
  string local_2250;
  CMReturn local_2230;
  uint64_t local_2218;
  uint64_t uStack_2210;
  uint64_t local_2208;
  pointer local_21f8;
  undefined8 uStack_21f0;
  undefined8 local_21e8;
  undefined8 uStack_21e0;
  undefined8 local_21d8;
  undefined8 uStack_21d0;
  allocator<char> local_21c1;
  string local_21c0;
  allocator<char> local_2199;
  string local_2198;
  undefined1 auStack_2178 [8];
  CMReturn res;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2155;
  key_equal local_2154;
  hasher local_2153;
  undefined1 local_2152;
  allocator<char> local_2151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2148;
  iterator local_2128;
  size_type local_2120;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2118;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_20e0;
  undefined1 local_20c8 [8];
  ConfusableMatcher matcher;
  CMOptions opts;
  char *local_80;
  char *local_78;
  pair<const_char_*,_const_char_*> local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  undefined1 local_20 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  map;
  
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_20);
  local_78 = " ";
  local_80 = " ";
  std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*,_true>
            (&local_70,&local_78,&local_80);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*,_const_char_*,_true>(&local_60,&local_70);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_20,&local_60);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_60);
  matcher.TheMap[0xff].
  super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_20e0,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_20);
  local_2152 = 1;
  local_2150 = &local_2148;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2148," ",&local_2151);
  local_2152 = 0;
  local_2128 = &local_2148;
  local_2120 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_2155);
  __l._M_len = local_2120;
  __l._M_array = local_2128;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&local_2118,__l,0,&local_2153,&local_2154,&local_2155);
  ConfusableMatcher::ConfusableMatcher((ConfusableMatcher *)local_20c8,&local_20e0,&local_2118,true)
  ;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set(&local_2118);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_2155);
  local_27a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2128;
  do {
    local_27a0 = local_27a0 + -1;
    std::__cxx11::string::~string((string *)local_27a0);
  } while (local_27a0 != &local_2148);
  std::allocator<char>::~allocator(&local_2151);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_20e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2198,"a Q Q f",&local_2199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_21c0,"Q Q",&local_21c1);
  local_21d8 = 1;
  uStack_21d0 = 0;
  local_21e8 = 0;
  uStack_21e0 = 1000000;
  local_21f8 = matcher.TheMap[0xff].
               super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  uStack_21f0 = 0;
  auVar1 = ZEXT824(matcher.TheMap[0xff].
                   super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Options.TimeoutNs = 1000000;
  Options.MatchRepeating = (bool)auVar1[0];
  Options._1_7_ = auVar1._1_7_;
  Options.StartIndex = auVar1._8_8_;
  Options.StartFromEnd = (bool)auVar1[0x10];
  Options._17_7_ = auVar1._17_7_;
  Options._32_8_ = 1;
  Options.ContainsPosPointers = (void *)0x0;
  ConfusableMatcher::IndexOf
            ((CMReturn *)auStack_2178,(ConfusableMatcher *)local_20c8,&local_2198,&local_21c0,
             Options);
  std::__cxx11::string::~string((string *)&local_21c0);
  std::allocator<char>::~allocator(&local_21c1);
  std::__cxx11::string::~string((string *)&local_2198);
  std::allocator<char>::~allocator(&local_2199);
  local_2208 = res.Size;
  local_2218 = (uint64_t)auStack_2178;
  uStack_2210 = res.Start;
  In.Size = res.Start;
  In.Start = (uint64_t)auStack_2178;
  In._16_8_ = res.Size;
  AssertMatch(In,2,3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2250,"aQ Q f",&local_2251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2278,"Q Q",&local_2279);
  local_2298 = 1;
  uStack_2290 = 0;
  local_22a8 = 0;
  uStack_22a0 = 1000000;
  local_22b8 = matcher.TheMap[0xff].
               super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  uStack_22b0 = 0;
  auVar1 = ZEXT824(matcher.TheMap[0xff].
                   super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Options_00.TimeoutNs = 1000000;
  Options_00.MatchRepeating = (bool)auVar1[0];
  Options_00._1_7_ = auVar1._1_7_;
  Options_00.StartIndex = auVar1._8_8_;
  Options_00.StartFromEnd = (bool)auVar1[0x10];
  Options_00._17_7_ = auVar1._17_7_;
  Options_00._32_8_ = 1;
  Options_00.ContainsPosPointers = (void *)0x0;
  ConfusableMatcher::IndexOf
            (&local_2230,(ConfusableMatcher *)local_20c8,&local_2250,&local_2278,Options_00);
  res.Size = local_2230._16_8_;
  auStack_2178 = (undefined1  [8])local_2230.Start;
  res.Start = local_2230.Size;
  std::__cxx11::string::~string((string *)&local_2278);
  std::allocator<char>::~allocator(&local_2279);
  std::__cxx11::string::~string((string *)&local_2250);
  std::allocator<char>::~allocator(&local_2251);
  local_22bc = WORD_BOUNDARY_FAIL_START;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2320,"Test35",&local_2321);
  std::operator+(&local_2300,&local_2320,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2368,"WORD_BOUNDARY_FAIL_START == res.Status",&local_2369);
  cute::cute_to_string::backslashQuoteTabNewline(&local_2348,&local_2368);
  std::operator+(&local_22e0,&local_2300,&local_2348);
  cute::assert_equal<_CM_RETURN_STATUS,_CM_RETURN_STATUS>
            (&local_22bc,(_CM_RETURN_STATUS *)&res.Size,&local_22e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x362);
  std::__cxx11::string::~string((string *)&local_22e0);
  std::__cxx11::string::~string((string *)&local_2348);
  std::__cxx11::string::~string((string *)&local_2368);
  std::allocator<char>::~allocator(&local_2369);
  std::__cxx11::string::~string((string *)&local_2300);
  std::__cxx11::string::~string((string *)&local_2320);
  std::allocator<char>::~allocator(&local_2321);
  local_2370 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_23d0,"Test35",&local_23d1);
  std::operator+(&local_23b0,&local_23d0,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2418,"1 == res.Start",&local_2419);
  cute::cute_to_string::backslashQuoteTabNewline(&local_23f8,&local_2418);
  std::operator+(&local_2390,&local_23b0,&local_23f8);
  cute::assert_equal<int,unsigned_long>
            (&local_2370,(unsigned_long *)auStack_2178,&local_2390,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x363);
  std::__cxx11::string::~string((string *)&local_2390);
  std::__cxx11::string::~string((string *)&local_23f8);
  std::__cxx11::string::~string((string *)&local_2418);
  std::allocator<char>::~allocator(&local_2419);
  std::__cxx11::string::~string((string *)&local_23b0);
  std::__cxx11::string::~string((string *)&local_23d0);
  std::allocator<char>::~allocator(&local_23d1);
  local_2420 = 3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2480,"Test35",&local_2481);
  std::operator+(&local_2460,&local_2480,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_24c8,"3 == res.Size",&local_24c9);
  cute::cute_to_string::backslashQuoteTabNewline(&local_24a8,&local_24c8);
  std::operator+(&local_2440,&local_2460,&local_24a8);
  cute::assert_equal<int,unsigned_long>
            (&local_2420,&res.Start,&local_2440,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x364);
  std::__cxx11::string::~string((string *)&local_2440);
  std::__cxx11::string::~string((string *)&local_24a8);
  std::__cxx11::string::~string((string *)&local_24c8);
  std::allocator<char>::~allocator(&local_24c9);
  std::__cxx11::string::~string((string *)&local_2460);
  std::__cxx11::string::~string((string *)&local_2480);
  std::allocator<char>::~allocator(&local_2481);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2508,"a Q Qf",&local_2509);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2530,"Q Q",&local_2531);
  local_2548 = 1;
  uStack_2540 = 0;
  local_2558 = 0;
  uStack_2550 = 1000000;
  local_2568 = matcher.TheMap[0xff].
               super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  uStack_2560 = 0;
  auVar1 = ZEXT824(matcher.TheMap[0xff].
                   super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Options_01.TimeoutNs = 1000000;
  Options_01.MatchRepeating = (bool)auVar1[0];
  Options_01._1_7_ = auVar1._1_7_;
  Options_01.StartIndex = auVar1._8_8_;
  Options_01.StartFromEnd = (bool)auVar1[0x10];
  Options_01._17_7_ = auVar1._17_7_;
  Options_01._32_8_ = 1;
  Options_01.ContainsPosPointers = (void *)0x0;
  ConfusableMatcher::IndexOf
            (&local_24e8,(ConfusableMatcher *)local_20c8,&local_2508,&local_2530,Options_01);
  res.Size = local_24e8._16_8_;
  auStack_2178 = (undefined1  [8])local_24e8.Start;
  res.Start = local_24e8.Size;
  std::__cxx11::string::~string((string *)&local_2530);
  std::allocator<char>::~allocator(&local_2531);
  std::__cxx11::string::~string((string *)&local_2508);
  std::allocator<char>::~allocator(&local_2509);
  local_256c = WORD_BOUNDARY_FAIL_END;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_25d0,"Test35",&local_25d1);
  std::operator+(&local_25b0,&local_25d0,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2618,"WORD_BOUNDARY_FAIL_END == res.Status",&local_2619);
  cute::cute_to_string::backslashQuoteTabNewline(&local_25f8,&local_2618);
  std::operator+(&local_2590,&local_25b0,&local_25f8);
  cute::assert_equal<_CM_RETURN_STATUS,_CM_RETURN_STATUS>
            (&local_256c,(_CM_RETURN_STATUS *)&res.Size,&local_2590,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x367);
  std::__cxx11::string::~string((string *)&local_2590);
  std::__cxx11::string::~string((string *)&local_25f8);
  std::__cxx11::string::~string((string *)&local_2618);
  std::allocator<char>::~allocator(&local_2619);
  std::__cxx11::string::~string((string *)&local_25b0);
  std::__cxx11::string::~string((string *)&local_25d0);
  std::allocator<char>::~allocator(&local_25d1);
  local_2620 = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2680,"Test35",&local_2681);
  std::operator+(&local_2660,&local_2680,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_26c8,"2 == res.Start",&local_26c9);
  cute::cute_to_string::backslashQuoteTabNewline(&local_26a8,&local_26c8);
  std::operator+(&local_2640,&local_2660,&local_26a8);
  cute::assert_equal<int,unsigned_long>
            (&local_2620,(unsigned_long *)auStack_2178,&local_2640,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x368);
  std::__cxx11::string::~string((string *)&local_2640);
  std::__cxx11::string::~string((string *)&local_26a8);
  std::__cxx11::string::~string((string *)&local_26c8);
  std::allocator<char>::~allocator(&local_26c9);
  std::__cxx11::string::~string((string *)&local_2660);
  std::__cxx11::string::~string((string *)&local_2680);
  std::allocator<char>::~allocator(&local_2681);
  local_26d0 = 3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2730,"Test35",&local_2731);
  std::operator+(&local_2710,&local_2730,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2778,"3 == res.Size",&local_2779);
  cute::cute_to_string::backslashQuoteTabNewline(&local_2758,&local_2778);
  std::operator+(&local_26f0,&local_2710,&local_2758);
  cute::assert_equal<int,unsigned_long>
            (&local_26d0,&res.Start,&local_26f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x369);
  std::__cxx11::string::~string((string *)&local_26f0);
  std::__cxx11::string::~string((string *)&local_2758);
  std::__cxx11::string::~string((string *)&local_2778);
  std::allocator<char>::~allocator(&local_2779);
  std::__cxx11::string::~string((string *)&local_2710);
  std::__cxx11::string::~string((string *)&local_2730);
  std::allocator<char>::~allocator(&local_2731);
  ConfusableMatcher::~ConfusableMatcher((ConfusableMatcher *)local_20c8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_20);
  return;
}

Assistant:

void Test35()
{
	std::vector<std::pair<std::string, std::string>> map;
	map.push_back(std::pair(" ", " "));

	CMOptions opts = { };
	opts.TimeoutNs = 1000000;
	opts.MatchOnWordBoundary = true;

	auto matcher = ConfusableMatcher(map, { " " });
	auto res = matcher.IndexOf("a Q Q f", "Q Q", opts);
	AssertMatch(res, 2, 3);

	res = matcher.IndexOf("aQ Q f", "Q Q", opts);
	ASSERT_EQUAL(WORD_BOUNDARY_FAIL_START, res.Status);
	ASSERT_EQUAL(1, res.Start);
	ASSERT_EQUAL(3, res.Size);

	res = matcher.IndexOf("a Q Qf", "Q Q", opts);
	ASSERT_EQUAL(WORD_BOUNDARY_FAIL_END, res.Status);
	ASSERT_EQUAL(2, res.Start);
	ASSERT_EQUAL(3, res.Size);
}